

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow::Funcs::NodeColumns(ImGuiColumns *columns)

{
  float fVar1;
  bool bVar2;
  ImGuiColumnData *pIVar3;
  float fVar4;
  uint local_14;
  int column_n;
  ImGuiColumns *columns_local;
  
  bVar2 = TreeNode((void *)(ulong)columns->ID,"Columns Id: 0x%08X, Count: %d, Flags: 0x%04X",
                   (ulong)columns->ID,(ulong)(uint)columns->Count,(ulong)(uint)columns->Flags);
  if (bVar2) {
    BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)",(double)(columns->OffMaxX - columns->OffMinX),
               (double)columns->OffMinX,(double)columns->OffMaxX);
    for (local_14 = 0; (int)local_14 < (columns->Columns).Size; local_14 = local_14 + 1) {
      pIVar3 = ImVector<ImGuiColumnData>::operator[](&columns->Columns,local_14);
      fVar1 = pIVar3->OffsetNorm;
      pIVar3 = ImVector<ImGuiColumnData>::operator[](&columns->Columns,local_14);
      fVar4 = GetColumnOffsetFromNorm(columns,pIVar3->OffsetNorm);
      BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)",(double)fVar1,(double)fVar4,
                 (ulong)local_14);
    }
    TreePop();
  }
  return;
}

Assistant:

static void NodeColumns(const ImGuiColumns* columns)
        {
            if (!ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                return;
            ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->OffMaxX - columns->OffMinX, columns->OffMinX, columns->OffMaxX);
            for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, GetColumnOffsetFromNorm(columns, columns->Columns[column_n].OffsetNorm));
            ImGui::TreePop();
        }